

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O2

void deqp::gles3::Functional::DepthStencilCaseUtil::generateStencilVisualizeCommands
               (TestRenderTarget *target,
               vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
               *commands)

{
  long lVar1;
  RenderCommand local_ec;
  int stencilValues [16];
  
  getStencilTestValues(target->stencilBits,0x10,stencilValues);
  lVar1 = 0;
  while (lVar1 != 0x10) {
    RenderCommand::RenderCommand(&local_ec);
    local_ec.params.visibleFace = FACETYPE_FRONT;
    local_ec.rect.left = 0;
    local_ec.rect.bottom = 0;
    local_ec.rect.width = target->width;
    local_ec.rect.height = target->height;
    local_ec.color.m_data[1] = (float)(int)(lVar1 + 1) * 0.0625;
    local_ec.color.m_data[0] = 0.0;
    local_ec.color.m_data[2] = 0.0;
    local_ec.color.m_data[3] = 0.0;
    local_ec.colorMask.m_data[0] = false;
    local_ec.colorMask.m_data[1] = true;
    local_ec.colorMask.m_data[2] = false;
    local_ec.colorMask.m_data[3] = false;
    local_ec.params.stencilTestEnabled = true;
    local_ec.params.stencil[0].function = 0x202;
    local_ec.params.stencil[0].reference = stencilValues[lVar1];
    local_ec.params.stencil[0].compareMask = 0xffffffff;
    local_ec.params.stencil[0].stencilFailOp = 0x1e00;
    local_ec.params.stencil[0].depthFailOp = 0x1e00;
    local_ec.params.stencil[0].depthPassOp = 0x1e00;
    local_ec.params.stencil[0].writeMask = 0;
    local_ec.params.stencil[1].reference = local_ec.params.stencil[0].reference;
    local_ec.params.stencil[1].function = 0x202;
    local_ec.params.stencil[1].depthPassOp = 0x1e00;
    local_ec.params.stencil[1].writeMask = 0;
    local_ec.params.stencil[1].depthFailOp = 0x1e00;
    local_ec.params.stencil[1].compareMask = 0xffffffff;
    local_ec.params.stencil[1].stencilFailOp = 0x1e00;
    std::
    vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
    ::push_back(commands,&local_ec);
    lVar1 = lVar1 + 1;
  }
  return;
}

Assistant:

void generateStencilVisualizeCommands (const TestRenderTarget& target, vector<RenderCommand>& commands)
{
	const int	numValues		= 4*4;
	float		colorStep		= 1.0f / numValues; // 0 is reserved for non-matching.
	int			stencilValues[numValues];

	getStencilTestValues(target.stencilBits, numValues, &stencilValues[0]);

	for (int ndx = 0; ndx < numValues; ndx++)
	{
		RenderCommand cmd;

		cmd.params.visibleFace							= rr::FACETYPE_FRONT;
		cmd.rect										= rr::WindowRectangle(0, 0, target.width, target.height);
		cmd.color										= Vec4(0.0f, colorStep*float(ndx+1), 0.0f, 0.0f);
		cmd.colorMask									= tcu::BVec4(false, true, false, false);
		cmd.params.stencilTestEnabled					= true;

		cmd.params.stencil[rr::FACETYPE_FRONT].function			= GL_EQUAL;
		cmd.params.stencil[rr::FACETYPE_FRONT].reference		= stencilValues[ndx];
		cmd.params.stencil[rr::FACETYPE_FRONT].compareMask		= ~0u;
		cmd.params.stencil[rr::FACETYPE_FRONT].stencilFailOp	= GL_KEEP;
		cmd.params.stencil[rr::FACETYPE_FRONT].depthFailOp		= GL_KEEP;
		cmd.params.stencil[rr::FACETYPE_FRONT].depthPassOp		= GL_KEEP;
		cmd.params.stencil[rr::FACETYPE_FRONT].writeMask		= 0u;

		cmd.params.stencil[rr::FACETYPE_BACK] = cmd.params.stencil[rr::FACETYPE_FRONT];

		commands.push_back(cmd);
	}
}